

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O0

bool __thiscall s2coding::EncodedS2PointVector::Init(EncodedS2PointVector *this,Decoder *decoder)

{
  size_t sVar1;
  Format *pFVar2;
  Decoder *decoder_local;
  EncodedS2PointVector *this_local;
  
  sVar1 = Decoder::avail(decoder);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pFVar2 = Decoder::ptr(decoder);
    this->format_ = *pFVar2 & 7;
    if (this->format_ == UNCOMPRESSED) {
      this_local._7_1_ = InitUncompressedFormat(this,decoder);
    }
    else if (this->format_ == CELL_IDS) {
      this_local._7_1_ = InitCellIdsFormat(this,decoder);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool EncodedS2PointVector::Init(Decoder* decoder) {
  if (decoder->avail() < 1) return false;

  // Peek at the format but don't advance the decoder; the format-specific
  // Init functions will do that.
  format_ = static_cast<Format>(*decoder->ptr() & kEncodingFormatMask);
  switch (format_) {
    case UNCOMPRESSED:
      return InitUncompressedFormat(decoder);

    case CELL_IDS:
      return InitCellIdsFormat(decoder);

    default:
      return false;
  }
}